

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O3

bool Kumu::PathResolveLinks(string *link_path,string *resolved_path,char separator)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  size_type sVar1;
  _Alloc_hider _Var2;
  int iVar3;
  _Node *p_Var4;
  ssize_t sVar5;
  size_t sVar6;
  int *piVar7;
  ILogSink *this;
  char *pcVar8;
  _List_node_base *p_Var9;
  bool bVar10;
  string tmp_path;
  PathCompList_t out_list;
  string next_link;
  PathCompList_t in_list;
  char link_buf [1024];
  string local_518;
  string local_4f8;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d8;
  string local_4c0;
  string local_4a0;
  string *local_480;
  _List_node_base *local_478;
  string local_470;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  string local_438 [32];
  
  local_450._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_450;
  local_450._M_impl._M_node._M_size = 0;
  local_4d8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_4d8;
  local_4d8._M_impl._M_node._M_size = 0;
  local_4d8._M_impl._M_node.super__List_node_base._M_prev =
       local_4d8._M_impl._M_node.super__List_node_base._M_next;
  local_450._M_impl._M_node.super__List_node_base._M_prev =
       local_450._M_impl._M_node.super__List_node_base._M_next;
  PathMakeCanonical(local_438,link_path,'/');
  PathToComponents(local_438,(PathCompList_t *)&local_450,separator);
  local_480 = resolved_path;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  if (local_450._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_450) {
    p_Var9 = local_450._M_impl._M_node.super__List_node_base._M_next;
    do {
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1);
      iVar3 = std::__cxx11::string::compare((char *)__args);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)__args), iVar3 == 0)) {
        __assert_fail("*i != \"..\" && *i != \".\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                      ,0x1d5,"bool Kumu::PathResolveLinks(const std::string &, std::string &, char)"
                     );
      }
      local_478 = p_Var9;
      p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &local_4d8,__args);
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      local_4d8._M_impl._M_node._M_size = local_4d8._M_impl._M_node._M_size + 1;
      do {
        ComponentsToAbsolutePath(&local_4c0,(PathCompList_t *)&local_4d8,separator);
        sVar5 = readlink(local_4c0._M_dataplus._M_p,(char *)local_438,0x400);
        if (sVar5 == -1) {
          piVar7 = __errno_location();
          iVar3 = 5;
          if (*piVar7 != 0x16) {
            this = DefaultLogSink();
            _Var2._M_p = local_4c0._M_dataplus._M_p;
            pcVar8 = strerror(*piVar7);
            iVar3 = 1;
            ILogSink::Error(this,"%s: readlink: %s\n",_Var2._M_p,pcVar8);
          }
        }
        else {
          if (0x3ff < sVar5) {
            __assert_fail("link_size < MaxFilePath",
                          "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                          ,0x1e6,
                          "bool Kumu::PathResolveLinks(const std::string &, std::string &, char)");
          }
          *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + sVar5) = 0;
          local_4f8._M_string_length = 0;
          local_4f8.field_2._M_local_buf[0] = '\0';
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&local_4d8);
          local_4d8._M_impl._M_node._M_size = 0;
          local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
          local_4d8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_4d8;
          local_4d8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_4d8;
          sVar6 = strlen((char *)local_438);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_518,local_438,(long)&local_438[0]._M_dataplus._M_p + sVar6);
          if (local_518._M_string_length == 0) {
            bVar10 = false;
          }
          else {
            bVar10 = *local_518._M_dataplus._M_p == '/';
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          sVar1 = local_4f8._M_string_length;
          if (bVar10) {
            strlen((char *)local_438);
            std::__cxx11::string::_M_replace((ulong)&local_4f8,0,(char *)sVar1,(ulong)local_438);
          }
          else {
            PathDirname(&local_470,&local_4c0,'/');
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
            sVar6 = strlen((char *)local_438);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4a0,local_438,(long)&local_438[0]._M_dataplus._M_p + sVar6);
            PathJoin(&local_518,&local_470,&local_4a0,'/');
            std::__cxx11::string::operator=((string *)&local_4f8,(string *)&local_518);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_518._M_dataplus._M_p != &local_518.field_2) {
              operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
              operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_470._M_dataplus._M_p != &local_470.field_2) {
              operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1
                             );
            }
          }
          PathMakeCanonical(&local_518,&local_4f8,'/');
          PathToComponents(&local_518,(PathCompList_t *)&local_4d8,separator);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,
                            CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                                     local_4f8.field_2._M_local_buf[0]) + 1);
          }
          iVar3 = 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
        }
      } while (iVar3 == 0);
      if (iVar3 != 5) {
        bVar10 = false;
        goto LAB_001139f2;
      }
      p_Var9 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_478->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var9 != (_List_node_base *)&local_450);
  }
  ComponentsToAbsolutePath(&local_4c0,(PathCompList_t *)&local_4d8,separator);
  std::__cxx11::string::operator=((string *)local_480,(string *)&local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  bVar10 = true;
LAB_001139f2:
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_4d8);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_450);
  return bVar10;
}

Assistant:

bool
Kumu::PathResolveLinks(const std::string& link_path, std::string& resolved_path, char separator)
{
  PathCompList_t in_list, out_list;
  PathToComponents(PathMakeCanonical(link_path), in_list, separator);
  PathCompList_t::iterator i;
  char link_buf[MaxFilePath];

  for ( i = in_list.begin(); i != in_list.end(); ++i )
    {
      assert ( *i != ".." && *i != "." );
      out_list.push_back(*i);

      for (;;)
	{
	  std::string next_link = ComponentsToAbsolutePath(out_list, separator);
	  ssize_t link_size = readlink(next_link.c_str(), link_buf, MaxFilePath);

	  if ( link_size == -1 )
	    {
	      if ( errno == EINVAL )
		break;

	      DefaultLogSink().Error("%s: readlink: %s\n", next_link.c_str(), strerror(errno));
	      return false;
	    }
	  
	  assert(link_size < MaxFilePath);
	  link_buf[link_size] = 0;
	  std::string tmp_path;
	  out_list.clear();

	  if ( PathIsAbsolute(link_buf) )
	    {
	      tmp_path = link_buf;
	    }
	  else
	    {
	      tmp_path = PathJoin(PathDirname(next_link), link_buf);
	    }

	  PathToComponents(PathMakeCanonical(tmp_path), out_list, separator);
	}
    }

  resolved_path = ComponentsToAbsolutePath(out_list, separator);
  return true;
}